

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::KernelTimeout::KernelTimeout
          (KernelTimeout *this,Duration d)

{
  bool bVar1;
  int64_t iVar2;
  Duration rhs;
  int64_t now;
  long local_88;
  int64_t nanos;
  KernelTimeout *this_local;
  Duration d_local;
  
  rhs = InfiniteDuration();
  bVar1 = lts_20250127::operator==(d,rhs);
  if (bVar1) {
    this->rep_ = 0xffffffffffffffff;
  }
  else {
    local_88 = ToInt64Nanoseconds(d);
    if (local_88 < 0) {
      local_88 = 0;
    }
    iVar2 = SteadyClockNow();
    if (0x7fffffffffffffff - iVar2 < local_88) {
      this->rep_ = 0xffffffffffffffff;
    }
    else {
      this->rep_ = (iVar2 + local_88) * 2 | 1;
    }
  }
  return;
}

Assistant:

KernelTimeout::KernelTimeout(absl::Duration d) {
  // `absl::InfiniteDuration()` is a common "no timeout" value and cheaper to
  // compare than convert.
  if (d == absl::InfiniteDuration()) {
    rep_ = kNoTimeout;
    return;
  }

  int64_t nanos = absl::ToInt64Nanoseconds(d);

  // Negative durations are normalized to 0.
  // In theory implementations should expire these timeouts immediately.
  if (nanos < 0) {
    nanos = 0;
  }

  int64_t now = SteadyClockNow();
  if (nanos > kMaxNanos - now) {
    // Durations that would be greater than kMaxNanos are converted to infinite.
    rep_ = kNoTimeout;
    return;
  }

  nanos += now;
  rep_ = (static_cast<uint64_t>(nanos) << 1) | uint64_t{1};
}